

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.cpp
# Opt level: O0

unique_ptr<Sock,_std::default_delete<Sock>_> ConnectDirectly(CService *dest,bool manual_connection)

{
  long lVar1;
  ConstevalFormatString<1U> fmt;
  ConstevalFormatString<1U> fmt_00;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  bool bVar2;
  undefined1 uVar3;
  byte bVar4;
  __uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true> in_RDI;
  long in_FS_OFFSET;
  socklen_t len;
  unique_ptr<Sock,_std::default_delete<Sock>_> sock;
  sockaddr_storage sockaddr;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffe3c;
  CService *in_stack_fffffffffffffe40;
  unique_ptr<Sock,_std::default_delete<Sock>_> *in_stack_fffffffffffffe48;
  function<std::unique_ptr<Sock,_std::default_delete<Sock>_>_(int,_int,_int)>
  *in_stack_fffffffffffffe50;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe58;
  undefined2 in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe62;
  undefined1 in_stack_fffffffffffffe63;
  int in_stack_fffffffffffffe64;
  undefined8 in_stack_fffffffffffffe68;
  undefined6 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe76;
  undefined1 in_stack_fffffffffffffe77;
  LogFlags in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffeac;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  undefined4 uVar6;
  undefined1 in_stack_fffffffffffffef0 [15];
  undefined1 in_stack_fffffffffffffeff;
  string *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  socklen_t in_stack_ffffffffffffff0c;
  sockaddr *in_stack_ffffffffffffff10;
  Sock *in_stack_ffffffffffffff18;
  unique_ptr<Sock,_std::default_delete<Sock>_> local_c8 [20];
  unique_ptr<Sock,_std::default_delete<Sock>_> local_28;
  Level in_stack_ffffffffffffffe0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CService::GetSAFamily(in_stack_fffffffffffffe40);
  std::function<std::unique_ptr<Sock,_std::default_delete<Sock>_>_(int,_int,_int)>::operator()
            (in_stack_fffffffffffffe50,(int)((ulong)in_stack_fffffffffffffe68 >> 0x20),
             (int)in_stack_fffffffffffffe68,in_stack_fffffffffffffe64);
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<Sock,_std::default_delete<Sock>_> *)
                     CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  if (bVar2) {
    uVar6 = 0x80;
    uVar3 = CService::GetSockAddr
                      ((CService *)
                       CONCAT44(in_stack_fffffffffffffe64,
                                CONCAT13(in_stack_fffffffffffffe63,
                                         CONCAT12(in_stack_fffffffffffffe62,
                                                  in_stack_fffffffffffffe60))),
                       (sockaddr *)in_stack_fffffffffffffe58,(socklen_t *)in_stack_fffffffffffffe50)
    ;
    if ((bool)uVar3) {
      std::unique_ptr<Sock,_std::default_delete<Sock>_>::operator*(in_stack_fffffffffffffe48);
      CService::ToStringAddrPort_abi_cxx11_
                ((CService *)
                 CONCAT17(in_stack_fffffffffffffe77,CONCAT16(uVar3,in_stack_fffffffffffffe70)));
      bVar2 = ConnectToSocket(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                              in_stack_ffffffffffffff0c,in_stack_ffffffffffffff00,
                              (bool)in_stack_fffffffffffffeff);
      bVar4 = bVar2 ^ 0xff;
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
      if ((bVar4 & 1) == 0) {
        std::unique_ptr<Sock,_std::default_delete<Sock>_>::unique_ptr
                  ((unique_ptr<Sock,_std::default_delete<Sock>_> *)
                   CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                   (unique_ptr<Sock,_std::default_delete<Sock>_> *)0x19898d7);
      }
      else {
        std::unique_ptr<Sock,std::default_delete<Sock>>::unique_ptr<std::default_delete<Sock>,void>
                  ((unique_ptr<Sock,_std::default_delete<Sock>_> *)
                   CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
      }
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffe58,(char *)in_stack_fffffffffffffe50);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffe58,(char *)in_stack_fffffffffffffe50);
      CService::ToStringAddrPort_abi_cxx11_
                ((CService *)
                 CONCAT17(in_stack_fffffffffffffe77,CONCAT16(uVar3,in_stack_fffffffffffffe70)));
      in_stack_fffffffffffffe48 = local_c8;
      uVar5 = 2;
      logging_function_00._M_str._0_4_ = in_stack_ffffffffffffff08;
      logging_function_00._M_len = (size_t)in_stack_ffffffffffffff00;
      logging_function_00._M_str._4_4_ = in_stack_ffffffffffffff0c;
      source_file_00._M_str._7_1_ = in_stack_fffffffffffffeff;
      source_file_00._0_15_ = in_stack_fffffffffffffef0;
      fmt_00.fmt._4_4_ = uVar6;
      fmt_00.fmt._0_4_ = in_stack_fffffffffffffee8;
      LogPrintFormatInternal<std::__cxx11::string>
                (logging_function_00,source_file_00,in_stack_fffffffffffffeac,
                 in_stack_fffffffffffffea0,in_stack_ffffffffffffffe0,fmt_00,
                 in_stack_fffffffffffffff0);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe3c,uVar5));
      std::unique_ptr<Sock,std::default_delete<Sock>>::unique_ptr<std::default_delete<Sock>,void>
                ((unique_ptr<Sock,_std::default_delete<Sock>_> *)
                 CONCAT44(in_stack_fffffffffffffe3c,uVar5));
    }
  }
  else {
    uVar3 = LogAcceptCategory(CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),Trace);
    if ((bool)uVar3) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffe58,(char *)in_stack_fffffffffffffe50);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffe58,(char *)in_stack_fffffffffffffe50);
      CService::ToStringAddrPort_abi_cxx11_
                ((CService *)
                 CONCAT17(uVar3,CONCAT16(in_stack_fffffffffffffe76,in_stack_fffffffffffffe70)));
      in_stack_fffffffffffffe48 = &local_28;
      in_stack_fffffffffffffe38 = 4;
      logging_function._M_str._0_4_ = in_stack_ffffffffffffff08;
      logging_function._M_len = (size_t)in_stack_ffffffffffffff00;
      logging_function._M_str._4_4_ = in_stack_ffffffffffffff0c;
      source_file._M_str._7_1_ = in_stack_fffffffffffffeff;
      source_file._0_15_ = in_stack_fffffffffffffef0;
      fmt.fmt._4_4_ = in_stack_fffffffffffffeec;
      fmt.fmt._0_4_ = in_stack_fffffffffffffee8;
      LogPrintFormatInternal<std::__cxx11::string>
                (logging_function,source_file,in_stack_fffffffffffffeac,in_stack_fffffffffffffea0,
                 in_stack_ffffffffffffffe0,fmt,in_stack_fffffffffffffff0);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    }
    std::unique_ptr<Sock,std::default_delete<Sock>>::unique_ptr<std::default_delete<Sock>,void>
              ((unique_ptr<Sock,_std::default_delete<Sock>_> *)
               CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  }
  std::unique_ptr<Sock,_std::default_delete<Sock>_>::~unique_ptr(in_stack_fffffffffffffe48);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (__uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true>)
         (tuple<Sock_*,_std::default_delete<Sock>_>)
         in_RDI.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
         super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
         super__Head_base<0UL,_Sock_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<Sock> ConnectDirectly(const CService& dest, bool manual_connection)
{
    auto sock = CreateSock(dest.GetSAFamily(), SOCK_STREAM, IPPROTO_TCP);
    if (!sock) {
        LogPrintLevel(BCLog::NET, BCLog::Level::Error, "Cannot create a socket for connecting to %s\n", dest.ToStringAddrPort());
        return {};
    }

    // Create a sockaddr from the specified service.
    struct sockaddr_storage sockaddr;
    socklen_t len = sizeof(sockaddr);
    if (!dest.GetSockAddr((struct sockaddr*)&sockaddr, &len)) {
        LogPrintf("Cannot get sockaddr for %s: unsupported network\n", dest.ToStringAddrPort());
        return {};
    }

    if (!ConnectToSocket(*sock, (struct sockaddr*)&sockaddr, len, dest.ToStringAddrPort(), manual_connection)) {
        return {};
    }

    return sock;
}